

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_insert_multiple_elements_Test::TestBody
          (VectorSUnitTest_insert_multiple_elements_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  iterator pvVar4;
  AssertHelper local_768;
  Message local_760;
  size_type local_758;
  uint local_74c;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_41;
  Message local_730;
  uint local_724;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_40;
  Message local_708;
  uint local_6fc;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_39;
  Message local_6e0;
  uint local_6d4;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_38;
  Message local_6b8;
  uint local_6ac;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_37;
  Message local_690;
  uint local_684;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_36;
  Message local_668;
  uint local_65c;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_35;
  Message local_640;
  uint local_634;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_34;
  Message local_618;
  uint local_60c;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_33;
  Message local_5f0;
  uint local_5e4;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_32;
  Message local_5c8;
  uint local_5bc;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_31;
  Message local_5a0;
  uint local_594;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_30;
  Message local_578;
  uint local_56c;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_29;
  iterator it3;
  Message local_540;
  size_type local_538;
  uint local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_28;
  Message local_510;
  uint local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_27;
  Message local_4e8;
  uint local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_26;
  Message local_4c0;
  uint local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_25;
  Message local_498;
  uint local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_24;
  Message local_470;
  uint local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_23;
  Message local_448;
  uint local_43c;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_22;
  Message local_420;
  uint local_414;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_21;
  Message local_3f8;
  uint local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_20;
  Message local_3d0;
  uint local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_19;
  Message local_3a8;
  uint local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_18;
  iterator it2;
  Message local_370;
  size_type local_368;
  uint local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_17;
  Message local_340;
  uint local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_16;
  Message local_318;
  uint local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_15;
  Message local_2f0;
  uint local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_14;
  Message local_2c8;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_13;
  Message local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_12;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_11;
  Message local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_10;
  Message local_228;
  uint local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_9;
  Message local_200;
  uint local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_8;
  iterator it1;
  Message local_1c8;
  size_type local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_7;
  Message local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_6;
  Message local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_5;
  Message local_148;
  uint local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_120;
  Message local_118;
  size_type local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  uint local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  uint local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  uint local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  initializer_list<unsigned_int> local_58;
  undefined1 local_48 [8];
  vector_s<unsigned_int,_10UL> v;
  VectorSUnitTest_insert_multiple_elements_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  local_58._M_array =
       (iterator)
       ((long)&gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 4);
  local_58._M_len = 3;
  v.data_ptr_ = (pointer)this;
  estl::vector_s<unsigned_int,_10UL>::vector_s((vector_s<unsigned_int,_10UL> *)local_48,&local_58);
  local_7c = 0;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_78,"0u","v[0]",&local_7c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x236,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b4 = 1;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_b0,"1u","v[1]",&local_b4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x237,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_dc = 2;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_d8,"2u","v[2]",&local_dc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_104 = 3;
  local_110 = estl::vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)local_48);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_100,"3u","v.size()",&local_104,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x239,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::begin((vector_s<unsigned_int,_10UL> *)local_48);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 10;
  estl::vector_s<unsigned_int,_10UL>::insert
            ((vector_s<unsigned_int,_10UL> *)local_48,pvVar4,0,
             (uint *)((long)&gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_13c = 0;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_138,"0u","v[0]",&local_13c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_164 = 1;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_160,"1u","v[1]",&local_164,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_18c = 2;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_188,"2u","v[2]",&local_18c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1b4 = 3;
  local_1c0 = estl::vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)local_48);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b0,"3u","v.size()",&local_1b4,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it1,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it1);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::begin((vector_s<unsigned_int,_10UL> *)local_48);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 10;
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::insert
                     ((vector_s<unsigned_int,_10UL> *)local_48,pvVar4,3,
                      (uint *)((long)&gtest_ar_8.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              + 4));
  local_1f4 = 10;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1f0,"10u","*it1",&local_1f4,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x244,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_21c = 10;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_218,"10u","*(it1 + 1)",&local_21c,pvVar4 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x245,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_244 = 10;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_240,"10u","*(it1 + 2)",&local_244,pvVar4 + 2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x246,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_26c = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_268,"10u","v[0]",&local_26c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x247,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_294 = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_290,"10u","v[1]",&local_294,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x248,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2bc = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2b8,"10u","v[2]",&local_2bc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x249,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_2e4 = 0;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2e0,"0u","v[3]",&local_2e4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_30c = 1;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_308,"1u","v[4]",&local_30c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_334 = 2;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_330,"2u","v[5]",&local_334,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_35c = 6;
  local_368 = estl::vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)local_48);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_358,"6u","v.size()",&local_35c,&local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x24d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it2,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it2);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::begin((vector_s<unsigned_int,_10UL> *)local_48);
  gtest_ar_18.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x14;
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::insert
                     ((vector_s<unsigned_int,_10UL> *)local_48,pvVar4 + 3,2,
                      (uint *)((long)&gtest_ar_18.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              + 4));
  local_39c = 0x14;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_398,"20u","*it2",&local_39c,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x251,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3c4 = 0x14;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3c0,"20u","*(it2 + 1)",&local_3c4,pvVar4 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x252,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3ec = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3e8,"10u","v[0]",&local_3ec,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x253,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_414 = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_410,"10u","v[1]",&local_414,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x254,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_43c = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_438,"10u","v[2]",&local_43c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x255,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_464 = 0x14;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_460,"20u","v[3]",&local_464,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x256,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  local_48c = 0x14;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_488,"20u","v[4]",&local_48c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,599,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  local_4b4 = 0;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4b0,"0u","v[5]",&local_4b4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,600,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4dc = 1;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4d8,"1u","v[6]",&local_4dc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x259,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_504 = 2;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,7);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_500,"2u","v[7]",&local_504,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_52c = 8;
  local_538 = estl::vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)local_48);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_528,"8u","v.size()",&local_52c,&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it3,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it3);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::end((vector_s<unsigned_int,_10UL> *)local_48);
  gtest_ar_29.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x32;
  pvVar4 = estl::vector_s<unsigned_int,_10UL>::insert
                     ((vector_s<unsigned_int,_10UL> *)local_48,pvVar4,2,
                      (uint *)((long)&gtest_ar_29.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              + 4));
  local_56c = 0x32;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_568,"50u","*it3",&local_56c,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x25f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  local_594 = 0x32;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_590,"50u","*(it3 + 1)",&local_594,pvVar4 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x260,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  local_5bc = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_5b8,"10u","v[0]",&local_5bc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x261,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  local_5e4 = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_5e0,"10u","v[1]",&local_5e4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x262,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  local_60c = 10;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_608,"10u","v[2]",&local_60c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_608);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x263,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  local_634 = 0x14;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_630,"20u","v[3]",&local_634,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x264,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_65c = 0x14;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_658,"20u","v[4]",&local_65c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x265,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_684 = 0;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_680,"0u","v[5]",&local_684,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x266,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  local_6ac = 1;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_6a8,"1u","v[6]",&local_6ac,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x267,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  local_6d4 = 2;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,7);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_6d0,"2u","v[7]",&local_6d4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x268,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  local_6fc = 0x32;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_6f8,"50u","v[8]",&local_6fc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x269,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  local_724 = 0x32;
  pvVar2 = estl::vector_s<unsigned_int,_10UL>::operator[]
                     ((vector_s<unsigned_int,_10UL> *)local_48,9);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_720,"50u","v[9]",&local_724,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x26a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  local_74c = 10;
  local_758 = estl::vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)local_48);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_748,"10u","v.size()",&local_74c,&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              (&local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x26b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_768,&local_760);
    testing::internal::AssertHelper::~AssertHelper(&local_768);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  estl::vector_s<unsigned_int,_10UL>::~vector_s((vector_s<unsigned_int,_10UL> *)local_48);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_multiple_elements)
{
    vector_s<unsigned, 10> v{0u,1u,2u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert zero elements
    v.insert(v.begin(), 0, 10u);
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert 3 elements from start
    const auto it1 = v.insert(v.begin(), 3, 10u);
    EXPECT_EQ(10u, *it1);
    EXPECT_EQ(10u, *(it1 + 1));
    EXPECT_EQ(10u, *(it1 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(0u, v[3]);
    EXPECT_EQ(1u, v[4]);
    EXPECT_EQ(2u, v[5]);
    EXPECT_EQ(6u, v.size());

    // Insert 2 elements in the middle
    const auto it2 = v.insert(v.begin()+3, 2, 20u);
    EXPECT_EQ(20u, *it2);
    EXPECT_EQ(20u, *(it2 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(8u, v.size());

    // Insert 2 elements 'in' the end
    const auto it3 = v.insert(v.end(), 2, 50u);
    EXPECT_EQ(50u, *it3);
    EXPECT_EQ(50u, *(it3 + 1));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(10u, v[1]);
    EXPECT_EQ(10u, v[2]);
    EXPECT_EQ(20u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(0u, v[5]);
    EXPECT_EQ(1u, v[6]);
    EXPECT_EQ(2u, v[7]);
    EXPECT_EQ(50u, v[8]);
    EXPECT_EQ(50u, v[9]);
    EXPECT_EQ(10u, v.size());
}